

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O0

void wavefront_starvation(size_t W)

{
  code *pcVar1;
  byte extraout_AL;
  reference pvVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  *this;
  void *__stat_loc;
  FlowBuilder *in_RDI;
  double __x;
  Expression_lhs<const_std::atomic<unsigned_long>_&> EVar4;
  ResultBuilder DOCTEST_RB;
  size_t next_j;
  size_t next_i;
  size_t j_1;
  size_t i_1;
  size_t j;
  size_t i;
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  G;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  atomic<unsigned_long> blocked;
  atomic<unsigned_long> count;
  atomic<unsigned_long> stop;
  Executor executor;
  Taskflow taskflow;
  string *in_stack_fffffffffffffac8;
  Result *res;
  Taskflow *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  Taskflow *in_stack_fffffffffffffae0;
  Executor *in_stack_fffffffffffffae8;
  Enum at;
  Taskflow *in_stack_fffffffffffffaf0;
  Executor *in_stack_fffffffffffffb00;
  Executor *c;
  FlowBuilder *this_00;
  ExpressionDecomposer local_4bc;
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  *local_4b8;
  undefined4 in_stack_fffffffffffffb54;
  Expression_lhs<const_std::atomic<unsigned_long>_&> *in_stack_fffffffffffffb58;
  undefined8 in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  __basic_future<void> local_410 [2];
  FlowBuilder *local_3f0;
  FlowBuilder *local_3e8;
  FlowBuilder *local_3e0;
  FlowBuilder *local_3d8;
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  undefined1 *local_350;
  Task local_348;
  FlowBuilder *local_340;
  FlowBuilder *local_338;
  undefined1 *local_330;
  FlowBuilder **local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  pointer *local_308;
  undefined1 *local_300;
  Task local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  Task local_2d0;
  FlowBuilder *local_2c8;
  FlowBuilder *local_2c0;
  Executor local_2b8 [2];
  FlowBuilder *local_8;
  
  local_8 = in_RDI;
  tf::Taskflow::Taskflow(in_stack_fffffffffffffaf0);
  this_00 = local_8;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8)
  ;
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffbb8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11ac15);
  local_2b8[0]._128_8_ = 0;
  std::mutex::mutex((mutex *)0x11ac2e);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             0x11ac3b);
  c = local_2b8;
  std::
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ::vector((vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
            *)0x11ac4d);
  std::
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ::resize((vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
            *)in_stack_fffffffffffffaf0,(size_type)in_stack_fffffffffffffae8);
  for (local_2c0 = (FlowBuilder *)0x0; local_2c0 < local_8;
      local_2c0 = (FlowBuilder *)((long)&local_2c0->_graph + 1)) {
    std::
    vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
    ::operator[]((vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                  *)local_2b8,(size_type)local_2c0);
    std::vector<tf::Task,_std::allocator<tf::Task>_>::resize
              ((vector<tf::Task,_std::allocator<tf::Task>_> *)in_stack_fffffffffffffaf0,
               (size_type)in_stack_fffffffffffffae8);
    for (local_2c8 = (FlowBuilder *)0x0; local_2c8 < local_8;
        local_2c8 = (FlowBuilder *)((long)&local_2c8->_graph + 1)) {
      if ((long)&local_2c8->_graph + (long)&local_2c0->_graph == 0) {
        local_2f0 = &local_2b8[0].field_0x80;
        local_2e8 = &local_2b8[0].field_0x88;
        local_2e0 = &local_2b8[0].field_0x78;
        local_2d8 = (undefined1 *)
                    ((long)&local_2b8[0]._taskflows_mutex.super___mutex_base._M_mutex + 0x18);
        tf::FlowBuilder::
        emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:740:36),_nullptr>
                  (this_00,(anon_class_32_4_8e44c508 *)c);
        pvVar2 = std::
                 vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                 ::operator[]((vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                               *)local_2b8,(size_type)local_2c0);
        pvVar3 = std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
                           (pvVar2,(size_type)local_2c8);
        tf::Task::operator=(pvVar3,&local_2d0);
      }
      else if ((FlowBuilder *)((long)&local_2c8->_graph + (long)((long)&local_2c0->_graph + 1)) ==
               local_8) {
        local_340 = local_2c0;
        local_338 = local_2c8;
        local_330 = &local_2b8[0].field_0x80;
        local_328 = &local_8;
        local_320 = &local_2b8[0].field_0x78;
        local_318 = &local_2b8[0].field_0x88;
        local_310 = (undefined1 *)
                    ((long)&local_2b8[0]._taskflows_mutex.super___mutex_base._M_mutex + 0x18);
        local_308 = (pointer *)
                    ((long)&local_2b8[0]._notifier._waiters.
                            super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                            ._M_impl.super__Vector_impl_data + 8);
        local_300 = (undefined1 *)
                    ((long)&local_2b8[0]._topology_mutex.super___mutex_base._M_mutex + 0x20);
        tf::FlowBuilder::
        emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:750:36),_nullptr>
                  (this_00,(anon_class_72_9_faf349e7 *)c);
        pvVar2 = std::
                 vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                 ::operator[]((vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                               *)local_2b8,(size_type)local_2c0);
        pvVar3 = std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
                           (pvVar2,(size_type)local_2c8);
        tf::Task::operator=(pvVar3,&local_2f8);
      }
      else {
        local_350 = &local_2b8[0].field_0x80;
        tf::FlowBuilder::
        emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:780:36),_nullptr>
                  (this_00,(anon_class_8_1_a7c1402f *)c);
        pvVar2 = std::
                 vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                 ::operator[]((vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                               *)local_2b8,(size_type)local_2c0);
        pvVar3 = std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
                           (pvVar2,(size_type)local_2c8);
        tf::Task::operator=(pvVar3,&local_348);
      }
      pvVar2 = std::
               vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
               ::operator[]((vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                             *)local_2b8,(size_type)local_2c0);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
                        (pvVar2,(size_type)local_2c8);
      std::__cxx11::to_string((unsigned_long)__lhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                     (char *)in_stack_fffffffffffffad0);
      std::__cxx11::to_string((unsigned_long)__lhs);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffb00);
      tf::Task::name((Task *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      std::__cxx11::string::~string(local_370);
      std::__cxx11::string::~string(local_3d0);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::string::~string(local_3b0);
    }
  }
  for (local_3d8 = (FlowBuilder *)0x0; local_3d8 < local_8;
      local_3d8 = (FlowBuilder *)((long)&local_3d8->_graph + 1)) {
    for (local_3e0 = (FlowBuilder *)0x0; local_3e0 < local_8;
        local_3e0 = (FlowBuilder *)((long)&local_3e0->_graph + 1)) {
      local_3e8 = (FlowBuilder *)((long)&local_3d8->_graph + 1);
      local_3f0 = (FlowBuilder *)((long)&local_3e0->_graph + 1);
      if (local_3e8 < local_8) {
        pvVar2 = std::
                 vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                 ::operator[]((vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                               *)local_2b8,(size_type)local_3d8);
        in_stack_fffffffffffffb00 =
             (Executor *)
             std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
                       (pvVar2,(size_type)local_3e0);
        pvVar2 = std::
                 vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                 ::operator[]((vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                               *)local_2b8,(size_type)local_3e8);
        std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[](pvVar2,(size_type)local_3e0);
        tf::Task::precede<tf::Task&>
                  ((Task *)in_stack_fffffffffffffad0,(Task *)in_stack_fffffffffffffac8);
      }
      if (local_3f0 < local_8) {
        in_stack_fffffffffffffae8 = local_2b8;
        pvVar2 = std::
                 vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                 ::operator[]((vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                               *)in_stack_fffffffffffffae8,(size_type)local_3d8);
        in_stack_fffffffffffffaf0 =
             (Taskflow *)
             std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
                       (pvVar2,(size_type)local_3e0);
        pvVar2 = std::
                 vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                 ::operator[]((vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                               *)in_stack_fffffffffffffae8,(size_type)local_3d8);
        std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[](pvVar2,(size_type)local_3f0);
        tf::Task::precede<tf::Task&>
                  ((Task *)in_stack_fffffffffffffad0,(Task *)in_stack_fffffffffffffac8);
      }
    }
  }
  __stat_loc = (void *)((long)&local_2b8[0]._topology_mutex.super___mutex_base._M_mutex + 0x20);
  tf::Executor::run_n(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                      CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  at = (Enum)((ulong)in_stack_fffffffffffffae8 >> 0x20);
  std::__basic_future<void>::wait(local_410,__stat_loc);
  tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffad0);
  res = (Result *)0x18308d;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)in_stack_fffffffffffffaf0,at,(char *)in_stack_fffffffffffffae0,
             in_stack_fffffffffffffadc,(char *)in_stack_fffffffffffffad0,"",
             (char *)in_stack_fffffffffffffb00);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4bc,DT_REQUIRE);
  EVar4 = doctest::detail::ExpressionDecomposer::operator<<<std::atomic<unsigned_long>,_nullptr>
                    ((ExpressionDecomposer *)in_stack_fffffffffffffad0,(atomic<unsigned_long> *)res)
  ;
  this = (vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
          *)EVar4.lhs;
  local_4b8 = this;
  doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
            (in_stack_fffffffffffffb58,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffb54,EVar4.m_at));
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffad0,res);
  doctest::detail::Result::~Result((Result *)0x11b37f);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffb78,__x);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffad0);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11b475);
  std::
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ::~vector(this);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             0x11b491);
  tf::Executor::~Executor(in_stack_fffffffffffffb00);
  tf::Taskflow::~Taskflow(in_stack_fffffffffffffad0);
  return;
}

Assistant:

void wavefront_starvation(size_t W) {
  
  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> stop, count{0}, blocked;
  
  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  std::vector<std::vector<tf::Task>> G;
  G.resize(W);

  // create tasks
  for(size_t i=0; i<W; i++) {
    G[i].resize(W);
    for(size_t j=0; j<W; j++) {
      // source
      if(i + j == 0) {
        G[i][j] = taskflow.emplace([&](){
          count.fetch_add(1, std::memory_order_relaxed);
          stop.store(false, std::memory_order_relaxed);
          blocked.store(0, std::memory_order_relaxed);
          set.clear();
        });
      }
      // diagonal tasks
      else if(i + j + 1 == W) {
        
        G[i][j] = taskflow.emplace([&, i, j](){

          count.fetch_add(1, std::memory_order_relaxed);
          
          // top-right will unblock all W-1 workers
          if(i == 0 && j + 1 == W) {
            while(blocked.load(std::memory_order_acquire) + 1 != W) {
              std::this_thread::yield();
            }
            stop.store(true, std::memory_order_relaxed);
            REQUIRE(set.size() + 1 == W);
          }
          else {
            // record the worker
            {
              std::scoped_lock lock(mutex);
              set.insert(executor.this_worker_id());
            }

            blocked.fetch_add(1, std::memory_order_release);

            // block the worker
            while(stop.load(std::memory_order_relaxed) == false) {
              std::this_thread::yield();
            }
          }
        });
      }
      // other tasks
      else {
        G[i][j] = taskflow.emplace([&](){
          count.fetch_add(1, std::memory_order_relaxed);
        });
      }

      // name the task
      G[i][j].name(std::to_string(i) + ", " + std::to_string(j));
    }
  }

  // create dependency
  for(size_t i=0; i<W; i++) {
    for(size_t j=0; j<W; j++) {
      size_t next_i = i + 1;
      size_t next_j = j + 1;
      if(next_i < W) {
        G[i][j].precede(G[next_i][j]);
      }
      if(next_j < W) {
        G[i][j].precede(G[i][next_j]);
      }
    }
  }

  //taskflow.dump(std::cout);
  executor.run_n(taskflow, 1024).wait();

  REQUIRE(count == W*W*1024);
}